

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::impl::anon_unknown_0::xpath_lexer::next(xpath_lexer *this)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  char_t terminator;
  char_t *cur;
  xpath_lexer *this_local;
  
  cur = this->_cur;
  while (((anonymous_namespace)::chartype_table[(byte)*cur] & 8) != 0) {
    cur = cur + 1;
  }
  this->_cur_lexeme_pos = cur;
  switch(*cur) {
  case '\0':
    this->_cur_lexeme = lex_eof;
    break;
  default:
    if (((anonymous_namespace)::chartypex_table[(byte)*cur] & 8) == 0) {
      if (((anonymous_namespace)::chartypex_table[(byte)*cur] & 4) == 0) {
        this->_cur_lexeme = lex_none;
      }
      else {
        (this->_cur_lexeme_contents).begin = cur;
        while (((anonymous_namespace)::chartypex_table[(byte)*cur] & 0x10) != 0) {
          cur = cur + 1;
        }
        if (*cur == ':') {
          if (cur[1] == '*') {
            cur = cur + 2;
          }
          else {
            bVar2 = (anonymous_namespace)::chartypex_table[(byte)cur[1]];
            while ((bVar2 & 0x10) != 0) {
              cur = cur + 1;
              bVar2 = (anonymous_namespace)::chartypex_table[(byte)*cur];
            }
          }
        }
        (this->_cur_lexeme_contents).end = cur;
        this->_cur_lexeme = lex_string;
      }
    }
    else {
      (this->_cur_lexeme_contents).begin = cur;
      while (((anonymous_namespace)::chartypex_table[(byte)*cur] & 8) != 0) {
        cur = cur + 1;
      }
      if (*cur == '.') {
        do {
          cur = cur + 1;
        } while (((anonymous_namespace)::chartypex_table[(byte)*cur] & 8) != 0);
      }
      (this->_cur_lexeme_contents).end = cur;
      this->_cur_lexeme = lex_number;
    }
    break;
  case '!':
    if (cur[1] == '=') {
      cur = cur + 2;
      this->_cur_lexeme = lex_not_equal;
    }
    else {
      this->_cur_lexeme = lex_none;
    }
    break;
  case '\"':
  case '\'':
    cVar1 = *cur;
    cur = cur + 1;
    (this->_cur_lexeme_contents).begin = cur;
    while( true ) {
      bVar3 = false;
      if (*cur != '\0') {
        bVar3 = *cur != cVar1;
      }
      if (!bVar3) break;
      cur = cur + 1;
    }
    (this->_cur_lexeme_contents).end = cur;
    if (*cur == '\0') {
      this->_cur_lexeme = lex_none;
    }
    else {
      cur = cur + 1;
      this->_cur_lexeme = lex_quoted_string;
    }
    break;
  case '$':
    cur = cur + 1;
    if (((anonymous_namespace)::chartypex_table[(byte)*cur] & 4) == 0) {
      this->_cur_lexeme = lex_none;
    }
    else {
      (this->_cur_lexeme_contents).begin = cur;
      while (((anonymous_namespace)::chartypex_table[(byte)*cur] & 0x10) != 0) {
        cur = cur + 1;
      }
      if (*cur == ':') {
        bVar2 = (anonymous_namespace)::chartypex_table[(byte)cur[1]];
        while ((bVar2 & 0x10) != 0) {
          cur = cur + 1;
          bVar2 = (anonymous_namespace)::chartypex_table[(byte)*cur];
        }
      }
      (this->_cur_lexeme_contents).end = cur;
      this->_cur_lexeme = lex_var_ref;
    }
    break;
  case '(':
    cur = cur + 1;
    this->_cur_lexeme = lex_open_brace;
    break;
  case ')':
    cur = cur + 1;
    this->_cur_lexeme = lex_close_brace;
    break;
  case '*':
    cur = cur + 1;
    this->_cur_lexeme = lex_multiply;
    break;
  case '+':
    cur = cur + 1;
    this->_cur_lexeme = lex_plus;
    break;
  case ',':
    cur = cur + 1;
    this->_cur_lexeme = lex_comma;
    break;
  case '-':
    cur = cur + 1;
    this->_cur_lexeme = lex_minus;
    break;
  case '.':
    if (cur[1] == '.') {
      cur = cur + 2;
      this->_cur_lexeme = lex_double_dot;
    }
    else if (((anonymous_namespace)::chartypex_table[(byte)cur[1]] & 8) == 0) {
      cur = cur + 1;
      this->_cur_lexeme = lex_dot;
    }
    else {
      (this->_cur_lexeme_contents).begin = cur;
      do {
        cur = cur + 1;
      } while (((anonymous_namespace)::chartypex_table[(byte)*cur] & 8) != 0);
      (this->_cur_lexeme_contents).end = cur;
      this->_cur_lexeme = lex_number;
    }
    break;
  case '/':
    if (cur[1] == '/') {
      cur = cur + 2;
      this->_cur_lexeme = lex_double_slash;
    }
    else {
      cur = cur + 1;
      this->_cur_lexeme = lex_slash;
    }
    break;
  case ':':
    if (cur[1] == ':') {
      cur = cur + 2;
      this->_cur_lexeme = lex_double_colon;
    }
    else {
      this->_cur_lexeme = lex_none;
    }
    break;
  case '<':
    if (cur[1] == '=') {
      cur = cur + 2;
      this->_cur_lexeme = lex_less_or_equal;
    }
    else {
      cur = cur + 1;
      this->_cur_lexeme = lex_less;
    }
    break;
  case '=':
    cur = cur + 1;
    this->_cur_lexeme = lex_equal;
    break;
  case '>':
    if (cur[1] == '=') {
      cur = cur + 2;
      this->_cur_lexeme = lex_greater_or_equal;
    }
    else {
      cur = cur + 1;
      this->_cur_lexeme = lex_greater;
    }
    break;
  case '@':
    cur = cur + 1;
    this->_cur_lexeme = lex_axis_attribute;
    break;
  case '[':
    cur = cur + 1;
    this->_cur_lexeme = lex_open_square_brace;
    break;
  case ']':
    cur = cur + 1;
    this->_cur_lexeme = lex_close_square_brace;
    break;
  case '|':
    cur = cur + 1;
    this->_cur_lexeme = lex_union;
  }
  this->_cur = cur;
  return;
}

Assistant:

void next()
		{
			const char_t* cur = _cur;

			while (PUGI_IMPL_IS_CHARTYPE(*cur, ct_space)) ++cur;

			// save lexeme position for error reporting
			_cur_lexeme_pos = cur;

			switch (*cur)
			{
			case 0:
				_cur_lexeme = lex_eof;
				break;

			case '>':
				if (*(cur+1) == '=')
				{
					cur += 2;
					_cur_lexeme = lex_greater_or_equal;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_greater;
				}
				break;

			case '<':
				if (*(cur+1) == '=')
				{
					cur += 2;
					_cur_lexeme = lex_less_or_equal;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_less;
				}
				break;

			case '!':
				if (*(cur+1) == '=')
				{
					cur += 2;
					_cur_lexeme = lex_not_equal;
				}
				else
				{
					_cur_lexeme = lex_none;
				}
				break;

			case '=':
				cur += 1;
				_cur_lexeme = lex_equal;

				break;

			case '+':
				cur += 1;
				_cur_lexeme = lex_plus;

				break;

			case '-':
				cur += 1;
				_cur_lexeme = lex_minus;

				break;

			case '*':
				cur += 1;
				_cur_lexeme = lex_multiply;

				break;

			case '|':
				cur += 1;
				_cur_lexeme = lex_union;

				break;

			case '$':
				cur += 1;

				if (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_start_symbol))
				{
					_cur_lexeme_contents.begin = cur;

					while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_symbol)) cur++;

					if (cur[0] == ':' && PUGI_IMPL_IS_CHARTYPEX(cur[1], ctx_symbol)) // qname
					{
						cur++; // :

						while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_symbol)) cur++;
					}

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_var_ref;
				}
				else
				{
					_cur_lexeme = lex_none;
				}

				break;

			case '(':
				cur += 1;
				_cur_lexeme = lex_open_brace;

				break;

			case ')':
				cur += 1;
				_cur_lexeme = lex_close_brace;

				break;

			case '[':
				cur += 1;
				_cur_lexeme = lex_open_square_brace;

				break;

			case ']':
				cur += 1;
				_cur_lexeme = lex_close_square_brace;

				break;

			case ',':
				cur += 1;
				_cur_lexeme = lex_comma;

				break;

			case '/':
				if (*(cur+1) == '/')
				{
					cur += 2;
					_cur_lexeme = lex_double_slash;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_slash;
				}
				break;

			case '.':
				if (*(cur+1) == '.')
				{
					cur += 2;
					_cur_lexeme = lex_double_dot;
				}
				else if (PUGI_IMPL_IS_CHARTYPEX(*(cur+1), ctx_digit))
				{
					_cur_lexeme_contents.begin = cur; // .

					++cur;

					while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_digit)) cur++;

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_number;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_dot;
				}
				break;

			case '@':
				cur += 1;
				_cur_lexeme = lex_axis_attribute;

				break;

			case '"':
			case '\'':
			{
				char_t terminator = *cur;

				++cur;

				_cur_lexeme_contents.begin = cur;
				while (*cur && *cur != terminator) cur++;
				_cur_lexeme_contents.end = cur;

				if (!*cur)
					_cur_lexeme = lex_none;
				else
				{
					cur += 1;
					_cur_lexeme = lex_quoted_string;
				}

				break;
			}

			case ':':
				if (*(cur+1) == ':')
				{
					cur += 2;
					_cur_lexeme = lex_double_colon;
				}
				else
				{
					_cur_lexeme = lex_none;
				}
				break;

			default:
				if (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_digit))
				{
					_cur_lexeme_contents.begin = cur;

					while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_digit)) cur++;

					if (*cur == '.')
					{
						cur++;

						while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_digit)) cur++;
					}

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_number;
				}
				else if (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_start_symbol))
				{
					_cur_lexeme_contents.begin = cur;

					while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_symbol)) cur++;

					if (cur[0] == ':')
					{
						if (cur[1] == '*') // namespace test ncname:*
						{
							cur += 2; // :*
						}
						else if (PUGI_IMPL_IS_CHARTYPEX(cur[1], ctx_symbol)) // namespace test qname
						{
							cur++; // :

							while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_symbol)) cur++;
						}
					}

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_string;
				}
				else
				{
					_cur_lexeme = lex_none;
				}
			}

			_cur = cur;
		}